

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImRect::ClipWithFull(ImRect *this,ImRect *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  float fVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  
  IVar8 = r->Max;
  fVar1 = (this->Min).x;
  fVar2 = (this->Min).y;
  fVar3 = (r->Min).x;
  fVar7 = (r->Min).y;
  if ((fVar7 <= fVar2) && (fVar7 = IVar8.y, fVar2 <= IVar8.y)) {
    fVar7 = fVar2;
  }
  if (fVar1 <= IVar8.x) {
    IVar8.x = fVar1;
  }
  uVar4 = -(uint)(fVar1 < fVar3);
  IVar5.x = (float)(uVar4 & (uint)fVar3 | ~uVar4 & (uint)IVar8.x);
  IVar5.y = fVar7;
  this->Min = IVar5;
  IVar9 = r->Max;
  fVar1 = (this->Max).x;
  fVar2 = (this->Max).y;
  fVar3 = (r->Min).x;
  fVar7 = (r->Min).y;
  if ((fVar7 <= fVar2) && (fVar7 = IVar9.y, fVar2 <= IVar9.y)) {
    fVar7 = fVar2;
  }
  if (fVar1 <= IVar9.x) {
    IVar9.x = fVar1;
  }
  uVar4 = -(uint)(fVar1 < fVar3);
  IVar6.x = (float)(uVar4 & (uint)fVar3 | ~uVar4 & (uint)IVar9.x);
  IVar6.y = fVar7;
  this->Max = IVar6;
  return;
}

Assistant:

bool        IsInverted() const                  { return Min.x > Max.x || Min.y > Max.y; }